

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O2

uint __thiscall
ON_RandomNumberGenerator::RandomUnsignedInteger(ON_RandomNumberGenerator *this,uint i0,uint i1)

{
  int iVar1;
  ON__UINT32 OVar2;
  
  iVar1 = i0 - i1;
  if (i0 < i1) {
    iVar1 = -(i0 - i1);
  }
  OVar2 = on_random_number(&this->m_rand_context);
  if (iVar1 != -1) {
    if (i0 < i1) {
      i1 = i0;
    }
    OVar2 = OVar2 % (iVar1 + 1U) + i1;
  }
  return OVar2;
}

Assistant:

unsigned int ON_RandomNumberGenerator::RandomUnsignedInteger(unsigned int i0, unsigned int i1)
{
  const ON__UINT32 r = RandomNumber();
  const ON__UINT32 delta = (i0 < i1) ? (i1 - i0) : (i0 - i1);
  return
    (0xFFFFFFFFU == delta)
    ? ((int)r) // avoid delta+1 overflow and crash
    : (((i0 < i1) ? i0 : i1) + (r % (delta + 1U)))
    ;
}